

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O1

void StripOnlyChild(TidyDocImpl *doc,Node *node)

{
  Node *pNVar1;
  
  pNVar1 = node->content;
  node->content = pNVar1->content;
  node->last = pNVar1->last;
  pNVar1->content = (Node *)0x0;
  prvTidyFreeNode(doc,pNVar1);
  for (pNVar1 = node->content; pNVar1 != (Node *)0x0; pNVar1 = pNVar1->next) {
    pNVar1->parent = node;
  }
  return;
}

Assistant:

static void StripOnlyChild(TidyDocImpl* doc, Node *node)
{
    Node *child;

    child = node->content;
    node->content = child->content;
    node->last = child->last;
    child->content = NULL;
    TY_(FreeNode)(doc, child);

    for (child = node->content; child; child = child->next)
        child->parent = node;
}